

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsolve.hpp
# Opt level: O1

void __thiscall
soplex::SPxSolverBase<double>::printDisplayLine
          (SPxSolverBase<double> *this,bool force,bool forceHead)

{
  SPxOut *pSVar1;
  ostream *poVar2;
  long lVar3;
  ostream *poVar4;
  long lVar5;
  char cVar6;
  int iVar7;
  char *pcVar8;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double extraout_XMM0_Qa_02;
  double extraout_XMM0_Qa_03;
  double extraout_XMM0_Qa_04;
  double dVar9;
  double dVar10;
  Verbosity old_verbosity;
  Verbosity local_30 [2];
  
  pSVar1 = this->spxout;
  if (pSVar1 == (SPxOut *)0x0) {
    return;
  }
  local_30[0] = pSVar1->m_verbosity;
  if ((int)local_30[0] < 3) {
    return;
  }
  local_30[1] = 3;
  (*pSVar1->_vptr_SPxOut[2])();
  if ((forceHead) || (this->displayLine % (this->displayFreq * 0x1e) == 0)) {
    std::__ostream_insert<char,std::char_traits<char>>
              (this->spxout->m_streams[this->spxout->m_verbosity],
               "type |   time |   iters | facts |    shift | viol sum | viol num | obj value ",0x4d)
    ;
    if (-1 < this->printBasisMetric) {
      std::__ostream_insert<char,std::char_traits<char>>
                (this->spxout->m_streams[this->spxout->m_verbosity]," | basis metric",0xf);
    }
    poVar2 = this->spxout->m_streams[this->spxout->m_verbosity];
    cVar6 = (char)poVar2;
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + cVar6);
    std::ostream::put(cVar6);
    std::ostream::flush();
  }
  if (force) {
    if (forceHead) goto LAB_001dee19;
  }
  else if (this->displayLine % this->displayFreq != 0 || forceHead) goto LAB_001dee19;
  pcVar8 = "  E  |";
  if (this->theType == LEAVE) {
    pcVar8 = "  L  |";
  }
  std::__ostream_insert<char,std::char_traits<char>>
            (this->spxout->m_streams[this->spxout->m_verbosity],pcVar8,6);
  pSVar1 = this->spxout;
  poVar2 = pSVar1->m_streams[pSVar1->m_verbosity];
  lVar3 = *(long *)poVar2;
  *(uint *)(poVar2 + *(long *)(lVar3 + -0x18) + 0x18) =
       *(uint *)(poVar2 + *(long *)(lVar3 + -0x18) + 0x18) & 0xfffffefb | 4;
  *(undefined8 *)(poVar2 + *(long *)(lVar3 + -0x18) + 0x10) = 7;
  *(undefined8 *)(poVar2 + *(long *)(lVar3 + -0x18) + 8) = 1;
  (*this->theTime->_vptr_Timer[6])();
  std::ostream::_M_insert<double>(extraout_XMM0_Qa);
  std::__ostream_insert<char,std::char_traits<char>>(pSVar1->m_streams[pSVar1->m_verbosity]," |",2);
  pSVar1 = this->spxout;
  poVar4 = (ostream *)pSVar1->m_streams[pSVar1->m_verbosity];
  lVar3 = *(long *)poVar4;
  *(uint *)(poVar4 + *(long *)(lVar3 + -0x18) + 0x18) =
       *(uint *)(poVar4 + *(long *)(lVar3 + -0x18) + 0x18) & 0xfffffefb | 0x100;
  *(undefined8 *)(poVar4 + *(long *)(lVar3 + -0x18) + 8) = 2;
  *(undefined8 *)(poVar4 + *(long *)(lVar3 + -0x18) + 0x10) = 8;
  std::ostream::operator<<(poVar4,(this->super_SPxBasisBase<double>).iterCount);
  std::__ostream_insert<char,std::char_traits<char>>(pSVar1->m_streams[pSVar1->m_verbosity]," | ",3)
  ;
  *(undefined8 *)
   (pSVar1->m_streams[pSVar1->m_verbosity] +
   *(long *)(*(long *)pSVar1->m_streams[pSVar1->m_verbosity] + -0x18) + 0x10) = 5;
  iVar7 = (*((this->super_SPxBasisBase<double>).factor)->_vptr_SLinSolver[0xb])();
  std::ostream::operator<<((ostream *)pSVar1->m_streams[pSVar1->m_verbosity],iVar7);
  std::__ostream_insert<char,std::char_traits<char>>(pSVar1->m_streams[pSVar1->m_verbosity]," | ",3)
  ;
  (*(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
    super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x6d])(this);
  std::ostream::_M_insert<double>(extraout_XMM0_Qa_00);
  std::__ostream_insert<char,std::char_traits<char>>(pSVar1->m_streams[pSVar1->m_verbosity]," | ",3)
  ;
  dVar10 = this->m_pricingViol + this->m_pricingViolCo;
  dVar9 = 0.0;
  if (0.0 <= dVar10) {
    dVar9 = dVar10;
  }
  std::ostream::_M_insert<double>(dVar9);
  std::__ostream_insert<char,std::char_traits<char>>(pSVar1->m_streams[pSVar1->m_verbosity]," | ",3)
  ;
  poVar4 = (ostream *)pSVar1->m_streams[pSVar1->m_verbosity];
  *(undefined8 *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x10) = 8;
  iVar7 = 0;
  if (0 < this->m_numViol) {
    iVar7 = this->m_numViol;
  }
  std::ostream::operator<<(poVar4,iVar7);
  std::__ostream_insert<char,std::char_traits<char>>(pSVar1->m_streams[pSVar1->m_verbosity]," | ",3)
  ;
  *(undefined8 *)
   (pSVar1->m_streams[pSVar1->m_verbosity] +
   *(long *)(*(long *)pSVar1->m_streams[pSVar1->m_verbosity] + -0x18) + 8) = 8;
  (*(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
    super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x5e])(this);
  std::ostream::_M_insert<double>(extraout_XMM0_Qa_01);
  if (this->printBasisMetric == 0) {
    pSVar1 = this->spxout;
    std::__ostream_insert<char,std::char_traits<char>>
              (pSVar1->m_streams[pSVar1->m_verbosity]," | ",3);
    poVar2 = pSVar1->m_streams[pSVar1->m_verbosity];
    lVar3 = *(long *)poVar2;
    lVar5 = *(long *)(lVar3 + -0x18);
    *(uint *)(poVar2 + lVar5 + 0x18) = *(uint *)(poVar2 + lVar5 + 0x18) & 0xfffffefb | 0x100;
    *(undefined8 *)(poVar2 + *(long *)(lVar3 + -0x18) + 8) = 2;
    (*(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
      super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x68])(this,0);
    std::ostream::_M_insert<double>(extraout_XMM0_Qa_02);
  }
  if (this->printBasisMetric == 1) {
    pSVar1 = this->spxout;
    std::__ostream_insert<char,std::char_traits<char>>
              (pSVar1->m_streams[pSVar1->m_verbosity]," | ",3);
    poVar2 = pSVar1->m_streams[pSVar1->m_verbosity];
    lVar3 = *(long *)poVar2;
    lVar5 = *(long *)(lVar3 + -0x18);
    *(uint *)(poVar2 + lVar5 + 0x18) = *(uint *)(poVar2 + lVar5 + 0x18) & 0xfffffefb | 0x100;
    *(undefined8 *)(poVar2 + *(long *)(lVar3 + -0x18) + 8) = 2;
    (*(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
      super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x68])(this,1);
    std::ostream::_M_insert<double>(extraout_XMM0_Qa_03);
  }
  if (this->printBasisMetric == 2) {
    pSVar1 = this->spxout;
    std::__ostream_insert<char,std::char_traits<char>>
              (pSVar1->m_streams[pSVar1->m_verbosity]," | ",3);
    poVar2 = pSVar1->m_streams[pSVar1->m_verbosity];
    lVar3 = *(long *)poVar2;
    lVar5 = *(long *)(lVar3 + -0x18);
    *(uint *)(poVar2 + lVar5 + 0x18) = *(uint *)(poVar2 + lVar5 + 0x18) & 0xfffffefb | 0x100;
    *(undefined8 *)(poVar2 + *(long *)(lVar3 + -0x18) + 8) = 2;
    (*(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
      super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x68])(this,2);
    std::ostream::_M_insert<double>(extraout_XMM0_Qa_04);
  }
  if (this->printBasisMetric == 3) {
    pSVar1 = this->spxout;
    std::__ostream_insert<char,std::char_traits<char>>
              (pSVar1->m_streams[pSVar1->m_verbosity]," | ",3);
    poVar2 = pSVar1->m_streams[pSVar1->m_verbosity];
    lVar3 = *(long *)poVar2;
    lVar5 = *(long *)(lVar3 + -0x18);
    *(uint *)(poVar2 + lVar5 + 0x18) = *(uint *)(poVar2 + lVar5 + 0x18) & 0xfffffefb | 0x100;
    *(undefined8 *)(poVar2 + *(long *)(lVar3 + -0x18) + 8) = 2;
    dVar9 = SPxBasisBase<double>::condition(&this->super_SPxBasisBase<double>,0x14,1e-06);
    std::ostream::_M_insert<double>(dVar9);
  }
  poVar2 = this->spxout->m_streams[this->spxout->m_verbosity];
  cVar6 = (char)poVar2;
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + cVar6);
  std::ostream::put(cVar6);
  std::ostream::flush();
LAB_001dee19:
  this->displayLine = this->displayLine + 1;
  (*this->spxout->_vptr_SPxOut[2])(this->spxout,local_30);
  return;
}

Assistant:

void SPxSolverBase<R>::printDisplayLine(const bool force, const bool forceHead)
{
   SPX_MSG_INFO1((*this->spxout),

                 if(forceHead || displayLine % (displayFreq * 30) == 0)
{
   (*this->spxout)
            << "type |   time |   iters | facts |    shift | viol sum | viol num | obj value ";

      if(printBasisMetric >= 0)
         (*this->spxout) << " | basis metric";

      (*this->spxout) << std::endl;
   }
   if((force || (displayLine % displayFreq == 0)) && !forceHead)
{
   (type() == LEAVE)
      ? (*this->spxout) << "  L  |" : (*this->spxout) << "  E  |";
      (*this->spxout) << std::fixed << std::setw(7) << std::setprecision(1) << time() << " |";
      (*this->spxout) << std::scientific << std::setprecision(2);
      (*this->spxout) << std::setw(8) << this->iteration() << " | "
                      << std::setw(5) << slinSolver()->getFactorCount() << " | "
                      << shift() << " | "
                      << SOPLEX_MAX(0.0, m_pricingViol + m_pricingViolCo) << " | "
                      << std::setw(8) << SOPLEX_MAX(0, m_numViol) << " | "
                      << std::setprecision(8) << value();

      if(printBasisMetric == 0)
         (*this->spxout) << " | " << std::scientific << std::setprecision(2) << getBasisMetric(0);

      if(printBasisMetric == 1)
         (*this->spxout) << " | " << std::scientific << std::setprecision(2) << getBasisMetric(1);

      if(printBasisMetric == 2)
         (*this->spxout) << " | " << std::scientific << std::setprecision(2) << getBasisMetric(2);

      if(printBasisMetric == 3)
         (*this->spxout) << " | " << std::scientific << std::setprecision(2) <<
                         basis().getEstimatedCondition();

      (*this->spxout) << std::endl;
   }